

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_hash_table_based.cpp
# Opt level: O2

void __thiscall
so_5::impl::hash_table_subscr_storage::storage_t::setup_content
          (storage_t *this,subscr_info_vector_t *info)

{
  pointer psVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer __args_1;
  pair<std::_Rb_tree_iterator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>,_bool>
  pVar3;
  map_t fresh_map;
  hash_table_t fresh_table;
  _Base_ptr local_b8;
  key_t local_b0;
  _Rb_tree<so_5::impl::hash_table_subscr_storage::key_t,_std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>,_std::_Select1st<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>,_std::less<so_5::impl::hash_table_subscr_storage::key_t>,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>_>
  local_98;
  _Hashtable<const_so_5::impl::hash_table_subscr_storage::key_t_*,_std::pair<const_so_5::impl::hash_table_subscr_storage::key_t_*const,_so_5::impl::event_handler_data_t>,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t_*const,_so_5::impl::event_handler_data_t>_>,_std::__detail::_Select1st,_so_5::impl::hash_table_subscr_storage::equal_to_t,_so_5::impl::hash_table_subscr_storage::hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  psVar1 = (info->
           super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  for (__args_1 = (info->
                  super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
                  )._M_impl.super__Vector_impl_data._M_start; __args_1 != psVar1;
      __args_1 = __args_1 + 1) {
    iVar2 = (*((__args_1->m_mbox).m_obj)->_vptr_abstract_message_box_t[2])();
    local_b0.m_mbox_id = CONCAT44(extraout_var,iVar2);
    local_b0.m_msg_type._M_target = (__args_1->m_msg_type)._M_target;
    local_b0.m_state = __args_1->m_state;
    pVar3 = std::
            _Rb_tree<so_5::impl::hash_table_subscr_storage::key_t,std::pair<so_5::impl::hash_table_subscr_storage::key_t_const,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>>,std::_Select1st<std::pair<so_5::impl::hash_table_subscr_storage::key_t_const,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>>>,std::less<so_5::impl::hash_table_subscr_storage::key_t>,std::allocator<std::pair<so_5::impl::hash_table_subscr_storage::key_t_const,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>>>>
            ::
            _M_emplace_unique<so_5::impl::hash_table_subscr_storage::key_t&,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&>
                      ((_Rb_tree<so_5::impl::hash_table_subscr_storage::key_t,std::pair<so_5::impl::hash_table_subscr_storage::key_t_const,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>>,std::_Select1st<std::pair<so_5::impl::hash_table_subscr_storage::key_t_const,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>>>,std::less<so_5::impl::hash_table_subscr_storage::key_t>,std::allocator<std::pair<so_5::impl::hash_table_subscr_storage::key_t_const,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>>>>
                        *)&local_98,&local_b0,&__args_1->m_mbox);
    local_b8 = pVar3.first._M_node._M_node + 1;
    std::
    _Hashtable<so_5::impl::hash_table_subscr_storage::key_t_const*,std::pair<so_5::impl::hash_table_subscr_storage::key_t_const*const,so_5::impl::event_handler_data_t>,std::allocator<std::pair<so_5::impl::hash_table_subscr_storage::key_t_const*const,so_5::impl::event_handler_data_t>>,std::__detail::_Select1st,so_5::impl::hash_table_subscr_storage::equal_to_t,so_5::impl::hash_table_subscr_storage::hash_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<so_5::impl::hash_table_subscr_storage::key_t_const*,so_5::impl::event_handler_data_t_const&>
              ((_Hashtable<so_5::impl::hash_table_subscr_storage::key_t_const*,std::pair<so_5::impl::hash_table_subscr_storage::key_t_const*const,so_5::impl::event_handler_data_t>,std::allocator<std::pair<so_5::impl::hash_table_subscr_storage::key_t_const*const,so_5::impl::event_handler_data_t>>,std::__detail::_Select1st,so_5::impl::hash_table_subscr_storage::equal_to_t,so_5::impl::hash_table_subscr_storage::hash_t,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_68,&local_b8,&__args_1->m_handler);
  }
  std::
  _Rb_tree<so_5::impl::hash_table_subscr_storage::key_t,_std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>,_std::_Select1st<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>,_std::less<so_5::impl::hash_table_subscr_storage::key_t>,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>_>
  ::swap(&(this->m_map)._M_t,&local_98);
  std::
  _Hashtable<const_so_5::impl::hash_table_subscr_storage::key_t_*,_std::pair<const_so_5::impl::hash_table_subscr_storage::key_t_*const,_so_5::impl::event_handler_data_t>,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t_*const,_so_5::impl::event_handler_data_t>_>,_std::__detail::_Select1st,_so_5::impl::hash_table_subscr_storage::equal_to_t,_so_5::impl::hash_table_subscr_storage::hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::swap(&(this->m_hash_table)._M_h,&local_68);
  std::
  _Hashtable<const_so_5::impl::hash_table_subscr_storage::key_t_*,_std::pair<const_so_5::impl::hash_table_subscr_storage::key_t_*const,_so_5::impl::event_handler_data_t>,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t_*const,_so_5::impl::event_handler_data_t>_>,_std::__detail::_Select1st,_so_5::impl::hash_table_subscr_storage::equal_to_t,_so_5::impl::hash_table_subscr_storage::hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Rb_tree<so_5::impl::hash_table_subscr_storage::key_t,_std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>,_std::_Select1st<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>,_std::less<so_5::impl::hash_table_subscr_storage::key_t>,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>_>
  ::~_Rb_tree(&local_98);
  return;
}

Assistant:

void
storage_t::setup_content(
	subscription_storage_common::subscr_info_vector_t && info )
	{
		using namespace std;
		using namespace subscription_storage_common;

		map_t fresh_map;
		hash_table_t fresh_table;

		for_each( begin(info), end(info),
			[&]( const subscr_info_t & i )
			{
				key_t k{ i.m_mbox->id(), i.m_msg_type, *(i.m_state) };

				auto ins_result = fresh_map.emplace( k, i.m_mbox );

				fresh_table.emplace( &(ins_result.first->first), i.m_handler );
			} );

		m_map.swap( fresh_map );
		m_hash_table.swap( fresh_table );
	}